

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

TestCase *
Catch::makeTestCase(TestCase *__return_storage_ptr__,ITestCase *_testCase,string *_className,
                   string *_name,string *_descOrTags,SourceLineInfo *_lineInfo)

{
  _Base_ptr *pp_Var1;
  _Rb_tree_header *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  int iVar5;
  iterator iVar6;
  bool bVar7;
  bool bVar8;
  string desc;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  TestCaseInfo info;
  string local_198;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  ITestCase *local_148;
  string *local_140;
  SourceLineInfo *local_138;
  key_type local_130;
  TestCaseInfo local_110;
  
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  pcVar4 = (_descOrTags->_M_dataplus)._M_p;
  local_138 = _lineInfo;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,pcVar4,pcVar4 + _descOrTags->_M_string_length);
  pp_Var1 = &local_178._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_178._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"./","");
  local_148 = _testCase;
  local_140 = _className;
  if (_name->_M_string_length <
      CONCAT44(local_178._M_impl.super__Rb_tree_header._M_header._4_4_,
               local_178._M_impl.super__Rb_tree_header._M_header._M_color)) {
    bVar7 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_110,(ulong)_name);
    if (local_110.name._M_string_length ==
        CONCAT44(local_178._M_impl.super__Rb_tree_header._M_header._4_4_,
                 local_178._M_impl.super__Rb_tree_header._M_header._M_color)) {
      if (local_110.name._M_string_length == 0) {
        bVar7 = true;
      }
      else {
        iVar5 = bcmp(local_110.name._M_dataplus._M_p,(void *)local_178._M_impl._0_8_,
                     local_110.name._M_string_length);
        bVar7 = iVar5 == 0;
      }
    }
    else {
      bVar7 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.name._M_dataplus._M_p != &local_110.name.field_2) {
      operator_delete(local_110.name._M_dataplus._M_p);
    }
  }
  if ((_Base_ptr *)local_178._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)local_178._M_impl._0_8_);
  }
  p_Var2 = &local_178._M_impl.super__Rb_tree_header;
  local_178._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_178._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_178._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_110.name._M_dataplus._M_p = (pointer)&PTR__TagExtracter_00152820;
  local_110.name.field_2._8_8_ = 0;
  local_110.className._M_dataplus._M_p._0_1_ = 0;
  local_178._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_178._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  local_110.name._M_string_length = (size_type)&local_178;
  local_110.name.field_2._M_allocated_capacity = (size_type)&local_110.className;
  TagParser::parse((TagParser *)&local_110,&local_198);
  paVar3 = &local_110.name.field_2;
  std::__cxx11::string::_M_assign((string *)&local_198);
  local_110.name._M_dataplus._M_p = (pointer)&PTR__TagExtracter_00152820;
  if ((string *)local_110.name.field_2._M_allocated_capacity != &local_110.className) {
    operator_delete((void *)local_110.name.field_2._M_allocated_capacity);
  }
  local_110.name._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"hide","");
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&local_178,&local_110.name);
  bVar8 = true;
  if ((_Rb_tree_header *)iVar6._M_node == p_Var2) {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,".","");
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&local_178,&local_130);
    bVar8 = (_Rb_tree_header *)iVar6._M_node != p_Var2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.name._M_dataplus._M_p != paVar3) {
    operator_delete(local_110.name._M_dataplus._M_p);
  }
  TestCaseInfo::TestCaseInfo
            (&local_110,_name,local_140,&local_198,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_178,(bool)(bVar8 | bVar7),local_138);
  TestCase::TestCase(__return_storage_ptr__,local_148,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.lineInfo.file._M_dataplus._M_p != &local_110.lineInfo.file.field_2) {
    operator_delete(local_110.lineInfo.file._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.tagsAsString._M_dataplus._M_p != &local_110.tagsAsString.field_2) {
    operator_delete(local_110.tagsAsString._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_110.tags._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.description._M_dataplus._M_p != &local_110.description.field_2) {
    operator_delete(local_110.description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_110.className._M_dataplus._M_p._1_7_,
                  local_110.className._M_dataplus._M_p._0_1_) != &local_110.className.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_110.className._M_dataplus._M_p._1_7_,
                             local_110.className._M_dataplus._M_p._0_1_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.name._M_dataplus._M_p != paVar3) {
    operator_delete(local_110.name._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

TestCase makeTestCase(  ITestCase* _testCase,
                            std::string const& _className,
                            std::string const& _name,
                            std::string const& _descOrTags,
                            SourceLineInfo const& _lineInfo )
    {
        std::string desc = _descOrTags;
        bool isHidden( startsWith( _name, "./" ) );
        std::set<std::string> tags;
        TagExtracter( tags ).parse( desc );
        if( tags.find( "hide" ) != tags.end() || tags.find( "." ) != tags.end() )
            isHidden = true;

        TestCaseInfo info( _name, _className, desc, tags, isHidden, _lineInfo );
        return TestCase( _testCase, info );
    }